

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O2

void tcu::separableConvolve<4,3>
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,int shiftX,int shiftY,
               vector<float,_std::allocator<float>_> *kernelX,
               vector<float,_std::allocator<float>_> *kernelY)

{
  uint6 uVar1;
  undefined1 auVar2 [13];
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  byte *pbVar11;
  int i;
  int iVar12;
  long lVar13;
  int iVar14;
  int kx;
  bool bVar15;
  int local_11c;
  Vector<float,_4> local_f8;
  Vec4 sum;
  PixelBufferAccess tmpAccess;
  tcu local_88 [16];
  TextureLevel tmp;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  
  TextureLevel::TextureLevel
            (&tmp,(TextureFormat *)dst,(dst->super_ConstPixelBufferAccess).m_size.m_data[1],
             (dst->super_ConstPixelBufferAccess).m_size.m_data[0],1);
  TextureLevel::getAccess(&tmpAccess,&tmp);
  uVar8 = (ulong)((long)(kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar6 = (ulong)((long)(kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  lVar13 = 0;
  iVar14 = (int)uVar8;
  uVar7 = 0;
  if (0 < iVar14) {
    uVar7 = uVar8 & 0xffffffff;
  }
  for (; uVar8 = (ulong)(src->m_size).m_data[1], lVar13 < (long)uVar8; lVar13 = lVar13 + 1) {
    for (iVar12 = 0; iVar12 < (src->m_size).m_data[0]; iVar12 = iVar12 + 1) {
      Vector<float,_4>::Vector(&sum,0.0);
      for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
        iVar3 = (iVar12 - shiftX) + (uint)uVar8;
        iVar10 = (src->m_size).m_data[0] + -1;
        if (iVar3 < iVar10) {
          iVar10 = iVar3;
        }
        lVar9 = 0;
        iVar10 = iVar10 * 3;
        if (iVar3 < 0) {
          iVar10 = 0;
        }
        pbVar11 = (byte *)((long)((src->m_pitch).m_data[1] * (int)lVar13) + (long)iVar10 +
                          (long)src->m_data);
        uVar4 = 0;
        for (; lVar9 != 0x18; lVar9 = lVar9 + 8) {
          uVar4 = uVar4 | (uint)*pbVar11 << ((byte)lVar9 & 0x1f);
          pbVar11 = pbVar11 + 1;
        }
        local_f8.m_data[2] = (float)(uVar4 >> 0x10 & 0xff);
        uVar1 = CONCAT24((short)(uVar4 >> 8),uVar4) & 0xff000000ff;
        local_f8.m_data[0] = (float)(int)uVar1;
        local_f8.m_data[1] = (float)(ushort)(uVar1 >> 0x20);
        local_f8.m_data[3] = 255.0;
        operator*(local_88,(kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start[(int)(~(uint)uVar8 + iVar14)],&local_f8)
        ;
        Vector<float,_4>::operator+=(&sum,(Vector<float,_4> *)local_88);
      }
      Vector<float,_4>::Vector(&local_40,&sum);
      dVar5 = toColor(&local_40);
      *(deUint32 *)
       ((long)tmpAccess.super_ConstPixelBufferAccess.m_data +
       (long)((int)lVar13 * 4) +
       (long)(tmpAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] * iVar12)) = dVar5;
    }
  }
  uVar7 = 0;
  if (0 < (int)uVar6) {
    uVar7 = uVar6 & 0xffffffff;
  }
  local_11c = -shiftY;
  for (iVar14 = 0; iVar14 < (int)uVar8; iVar14 = iVar14 + 1) {
    for (lVar13 = 0; lVar13 < (src->m_size).m_data[0]; lVar13 = lVar13 + 1) {
      Vector<float,_4>::Vector(&sum,0.0);
      uVar8 = uVar7;
      iVar12 = local_11c;
      lVar9 = uVar6 << 0x20;
      while (lVar9 = lVar9 + -0x100000000, bVar15 = uVar8 != 0, uVar8 = uVar8 - 1, bVar15) {
        iVar10 = tmp.m_size.m_data[0] + -1;
        if (iVar12 < tmp.m_size.m_data[0] + -1) {
          iVar10 = iVar12;
        }
        iVar10 = iVar10 << 2;
        if (iVar12 < 0) {
          iVar10 = 0;
        }
        uVar4 = *(uint *)((long)tmpAccess.super_ConstPixelBufferAccess.m_data +
                         (long)iVar10 +
                         (long)(tmpAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] *
                               (int)lVar13));
        auVar2[0xc] = (char)(uVar4 >> 0x18);
        auVar2._0_12_ = ZEXT712(0);
        local_f8.m_data[2] = (float)(int)CONCAT32(auVar2._10_3_,(ushort)(byte)(uVar4 >> 0x10));
        local_f8.m_data[3] = (float)(uint3)(auVar2._10_3_ >> 0x10);
        local_f8.m_data[1] = (float)(uVar4 >> 8 & 0xff);
        local_f8.m_data[0] = (float)(uVar4 & 0xff);
        operator*(local_88,*(float *)((long)(kernelY->
                                            super__Vector_base<float,_std::allocator<float>_>).
                                            _M_impl.super__Vector_impl_data._M_start +
                                     (lVar9 >> 0x1e)),&local_f8);
        Vector<float,_4>::operator+=(&sum,(Vector<float,_4> *)local_88);
        iVar12 = iVar12 + 1;
      }
      Vector<float,_4>::Vector(&local_50,&sum);
      dVar5 = toColor(&local_50);
      *(deUint32 *)
       ((long)(dst->super_ConstPixelBufferAccess).m_data +
       (long)((int)lVar13 * 4) +
       (long)((dst->super_ConstPixelBufferAccess).m_pitch.m_data[1] * iVar14)) = dVar5;
    }
    uVar8 = (ulong)(uint)(src->m_size).m_data[1];
    local_11c = local_11c + 1;
  }
  TextureLevel::~TextureLevel(&tmp);
  return;
}

Assistant:

static void separableConvolve (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, int shiftX, int shiftY, const std::vector<float>& kernelX, const std::vector<float>& kernelY)
{
	DE_ASSERT(dst.getWidth() == src.getWidth() && dst.getHeight() == src.getHeight());

	TextureLevel		tmp			(dst.getFormat(), dst.getHeight(), dst.getWidth());
	PixelBufferAccess	tmpAccess	= tmp.getAccess();

	int kw = (int)kernelX.size();
	int kh = (int)kernelY.size();

	// Horizontal pass
	// \note Temporary surface is written in column-wise order
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0);

			for (int kx = 0; kx < kw; kx++)
			{
				float		f = kernelX[kw-kx-1];
				deUint32	p = readUnorm8<SrcChannels>(src, de::clamp(i+kx-shiftX, 0, src.getWidth()-1), j);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(tmpAccess, j, i, toColor(sum));
		}
	}

	// Vertical pass
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0.0f);

			for (int ky = 0; ky < kh; ky++)
			{
				float		f = kernelY[kh-ky-1];
				deUint32	p = readUnorm8<DstChannels>(tmpAccess, de::clamp(j+ky-shiftY, 0, tmp.getWidth()-1), i);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(dst, i, j, toColor(sum));
		}
	}
}